

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::free(BTreeImpl *this,void *__ptr)

{
  size_t size;
  NodeUnion *pNVar1;
  NodeUnion *node;
  uint pos_local;
  BTreeImpl *this_local;
  
  compilerBarrier();
  pNVar1 = this->tree + ((ulong)__ptr & 0xffffffff);
  (pNVar1->field_0).freelist.nextOffset = (this->freelistHead - (uint)__ptr) + -1;
  size = size<unsigned_int,15ul>((uint (*) [15])((long)&pNVar1->field_0 + 4));
  azero<unsigned_int>((pNVar1->field_0).freelist.zero,size);
  this->freelistHead = (uint)__ptr;
  this->freelistSize = this->freelistSize + 1;
  return;
}

Assistant:

inline void BTreeImpl::free(uint pos) {
  // Add the given node to the freelist.

  // HACK: This is typically called on a node immediately after copying its contents away, but the
  //   pointer used to copy it away may be a different pointer pointing to a different union member
  //   which the compiler may not recgonize as aliasing with this object. Just to be extra-safe,
  //   insert a compiler barrier.
  compilerBarrier();

  auto& node = tree[pos];
  node.freelist.nextOffset = freelistHead - pos - 1;
  azero(node.freelist.zero, kj::size(node.freelist.zero));
  freelistHead = pos;
  ++freelistSize;
}